

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t driver::zeKernelGetName(ze_kernel_handle_t hKernel,size_t *pSize,char *pName)

{
  ze_result_t zVar1;
  
  if (DAT_0010e680 != (code *)0x0) {
    zVar1 = (*DAT_0010e680)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelGetName(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        size_t* pSize,                                  ///< [in,out] size of kernel name string, including null terminator, in
                                                        ///< bytes.
        char* pName                                     ///< [in,out][optional] char pointer to kernel name.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetName = context.zeDdiTable.Kernel.pfnGetName;
        if( nullptr != pfnGetName )
        {
            result = pfnGetName( hKernel, pSize, pName );
        }
        else
        {
            // generic implementation
        }

        return result;
    }